

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O3

void ebur128_check_true_peak(ebur128_state *st,size_t frames)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ebur128_state_internal *peVar5;
  interpolator *piVar6;
  float **ppfVar7;
  float *pfVar8;
  interp_filter *piVar9;
  double *pdVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  float *pfVar17;
  long lVar18;
  float *pfVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  float fVar23;
  double dVar24;
  float *local_70;
  
  peVar5 = st->d;
  piVar6 = peVar5->interp;
  uVar2 = piVar6->factor;
  uVar11 = (ulong)uVar2;
  if (frames != 0) {
    pfVar17 = peVar5->resampler_buffer_input;
    local_70 = peVar5->resampler_buffer_output;
    uVar3 = piVar6->channels;
    uVar13 = (ulong)uVar3;
    uVar4 = piVar6->delay;
    uVar14 = piVar6->zi;
    sVar12 = 0;
    do {
      if (uVar13 != 0) {
        ppfVar7 = piVar6->z;
        uVar15 = 0;
        do {
          pfVar8 = ppfVar7[uVar15];
          pfVar8[uVar14] = *pfVar17;
          if (uVar11 != 0) {
            pfVar19 = local_70 + uVar15;
            piVar9 = piVar6->filter;
            uVar16 = 0;
            do {
              if ((ulong)piVar9[uVar16].count == 0) {
                fVar23 = 0.0;
              }
              else {
                dVar24 = 0.0;
                uVar21 = 0;
                do {
                  iVar22 = uVar14 - piVar9[uVar16].index[uVar21];
                  dVar24 = dVar24 + (double)pfVar8[(int)((iVar22 >> 0x1f & uVar4) + iVar22)] *
                                    piVar9[uVar16].coeff[uVar21];
                  uVar21 = uVar21 + 1;
                } while (piVar9[uVar16].count != uVar21);
                fVar23 = (float)dVar24;
              }
              *pfVar19 = fVar23;
              pfVar19 = pfVar19 + uVar13;
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar11);
          }
          pfVar17 = pfVar17 + 1;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar13);
      }
      uVar14 = uVar14 + 1;
      if (uVar14 == uVar4) {
        uVar14 = 0;
      }
      local_70 = local_70 + uVar3 * uVar2;
      piVar6->zi = uVar14;
      sVar12 = sVar12 + 1;
    } while (sVar12 != frames);
  }
  if (uVar11 * frames != 0) {
    uVar13 = (ulong)st->channels;
    lVar18 = 0;
    lVar20 = 0;
    do {
      if (uVar13 != 0) {
        pdVar10 = st->d->prev_true_peak;
        pfVar17 = st->d->resampler_buffer_output;
        uVar15 = 0;
        do {
          fVar23 = *(float *)((long)pfVar17 + uVar15 * 4 + lVar18);
          dVar24 = (double)fVar23;
          if (fVar23 <= 0.0) {
            dVar24 = -dVar24;
          }
          pdVar1 = pdVar10 + uVar15;
          if (*pdVar1 <= dVar24 && dVar24 != *pdVar1) {
            pdVar10[uVar15] = dVar24;
          }
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + uVar13 * 4;
    } while (lVar20 != uVar11 * frames);
  }
  return;
}

Assistant:

static void ebur128_check_true_peak(ebur128_state* st, size_t frames) {
  size_t c, i, frames_out;

  frames_out =
      interp_process(st->d->interp, frames, st->d->resampler_buffer_input,
                     st->d->resampler_buffer_output);

  for (i = 0; i < frames_out; ++i) {
    for (c = 0; c < st->channels; ++c) {
      double val =
          (double) st->d->resampler_buffer_output[i * st->channels + c];

      if (EBUR128_MAX(val, -val) > st->d->prev_true_peak[c]) {
        st->d->prev_true_peak[c] = EBUR128_MAX(val, -val);
      }
    }
  }
}